

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::detail::read_content_chunked(detail *this,Stream *strm,ContentReceiver *out)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  __ssize_t _Var4;
  int *piVar5;
  long lVar6;
  FILE *pFVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  FILE *__stream;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  size_t *psVar10;
  size_t *extraout_RDX_01;
  size_t *extraout_RDX_02;
  size_t *extraout_RDX_03;
  size_t *extraout_RDX_04;
  size_t *__n;
  size_t *extraout_RDX_05;
  size_t *extraout_RDX_06;
  int iVar11;
  uint uVar12;
  _Any_data *p_Var13;
  char **__endptr;
  _Any_data *__x;
  _Any_data *p_Var14;
  _Any_data *p_Var15;
  undefined1 auVar16 [16];
  stream_line_reader line_reader;
  char buf [16];
  undefined1 local_10e8 [8];
  unsigned_long local_10e0;
  undefined1 local_10d8 [16];
  size_t local_10c8;
  size_t local_10c0;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [24];
  char *pcStack_1090;
  code *local_1088;
  code *pcStack_1080;
  _Any_data *local_1070;
  _Any_data local_1068;
  _IO_marker *local_1058;
  _IO_FILE *local_1050;
  char local_1048 [16];
  _Any_data local_1038;
  _Any_data local_1028 [255];
  
  local_10b8._0_8_ = local_10a8;
  local_10d8._8_8_ = local_1048;
  local_10c8 = 0x10;
  local_10c0 = 0;
  local_10b8._8_8_ = (char *)0x0;
  local_10a8[0] = '\0';
  local_10d8._0_8_ = this;
  local_1070 = (_Any_data *)strm;
  _Var4 = stream_line_reader::getline
                    ((stream_line_reader *)local_10d8,(char **)strm,(size_t *)out,
                     (FILE *)local_10b8._0_8_);
  if ((char)_Var4 == '\0') goto LAB_0016755b;
  __stream = (FILE *)(local_10d8 + 8);
  pFVar7 = (FILE *)local_10b8;
  if ((char *)local_10b8._8_8_ == (char *)0x0) {
    pFVar7 = __stream;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1038._M_pod_data,*(char **)pFVar7,(allocator<char> *)&local_10e0);
  uVar9 = local_1038._M_unused._0_8_;
  piVar5 = __errno_location();
  iVar3 = *piVar5;
  *piVar5 = 0;
  __endptr = (char **)local_10e8;
  lVar6 = strtol((char *)uVar9,__endptr,0x10);
  if (local_10e8 == (undefined1  [8])uVar9) {
LAB_001675aa:
    std::__throw_invalid_argument("stoi");
LAB_001675b6:
    uVar9 = std::__throw_out_of_range("stoi");
    if ((FILE *)local_10b8._0_8_ != (FILE *)local_10a8) {
      operator_delete((void *)local_10b8._0_8_,CONCAT71(local_10a8._1_7_,local_10a8[0]) + 1);
    }
    _Unwind_Resume(uVar9);
  }
  iVar11 = (int)lVar6;
  if ((iVar11 != lVar6) || (*piVar5 == 0x22)) goto LAB_001675b6;
  if (*piVar5 == 0) {
    *piVar5 = iVar3;
  }
  psVar10 = extraout_RDX;
  __x = local_1070;
  if ((_Any_data *)local_1038._M_unused._0_8_ != local_1028) {
    __endptr = (char **)(local_1028[0]._M_unused._M_member_pointer + 1);
    operator_delete(local_1038._M_unused._M_object,(ulong)__endptr);
    psVar10 = extraout_RDX_00;
    __x = local_1070;
  }
  while (uVar12 = (uint)lVar6, local_1070 = __x, 0 < iVar11) {
    local_1088 = (code *)0x0;
    pcStack_1080 = (code *)0x0;
    local_10a8._16_8_ = (char *)0x0;
    pcStack_1090 = (char *)0x0;
    std::function<bool_(const_char_*,_unsigned_long)>::function
              ((function<bool_(const_char_*,_unsigned_long)> *)&local_1068,
               (function<bool_(const_char_*,_unsigned_long)> *)__x);
    p_Var13 = (_Any_data *)(ulong)(uVar12 & 0x7fffffff);
    p_Var15 = (_Any_data *)0x0;
    do {
      p_Var14 = p_Var15;
      psVar10 = (size_t *)((long)p_Var13 - (long)p_Var14);
      if (p_Var13 < p_Var14 || psVar10 == (size_t *)0x0) break;
      if ((size_t *)0xfff < psVar10) {
        psVar10 = (size_t *)0x1000;
      }
      __x = &local_1038;
      auVar16 = (**(code **)(*(long *)this + 0x10))(this,&local_1038,psVar10);
      psVar10 = auVar16._8_8_;
      if (auVar16._0_4_ < 1) {
LAB_001673b7:
        bVar2 = false;
        p_Var15 = p_Var14;
      }
      else {
        p_Var15 = (_Any_data *)(auVar16._0_8_ & 0xffffffff);
        local_10e8 = (undefined1  [8])&local_1038;
        local_10e0 = (unsigned_long)p_Var15;
        if (local_1058 == (_IO_marker *)0x0) {
          std::__throw_bad_function_call();
        }
        __x = (_Any_data *)local_10e8;
        cVar1 = (*(code *)local_1050)(&local_1068,__x,&local_10e0);
        psVar10 = extraout_RDX_01;
        if (cVar1 == '\0') goto LAB_001673b7;
        p_Var15 = (_Any_data *)(p_Var14->_M_pod_data + (long)p_Var15->_M_pod_data);
        if (local_1088 == (code *)0x0) {
LAB_001673b3:
          bVar2 = true;
        }
        else {
          __x = (_Any_data *)local_10e8;
          local_10e8 = (undefined1  [8])p_Var15;
          local_10e0 = (unsigned_long)p_Var13;
          bVar2 = (*pcStack_1080)((_Any_data *)(local_10a8 + 0x10),(char **)__x,&local_10e0);
          psVar10 = extraout_RDX_02;
          if (bVar2) goto LAB_001673b3;
          bVar2 = false;
        }
      }
    } while (bVar2);
    if (local_1058 != (_IO_marker *)0x0) {
      __x = &local_1068;
      (*(code *)local_1058)(__x,__x,3);
      psVar10 = extraout_RDX_03;
    }
    if (local_1088 != (code *)0x0) {
      __x = (_Any_data *)(local_10a8 + 0x10);
      (*local_1088)(__x,__x,__destroy_functor);
      psVar10 = extraout_RDX_04;
    }
    if (p_Var14 < p_Var13) goto LAB_0016755b;
    _Var4 = stream_line_reader::getline
                      ((stream_line_reader *)local_10d8,(char **)__x,psVar10,__stream);
    if ((char)_Var4 == '\0') goto LAB_0016755b;
    __stream = (FILE *)(local_10d8 + 8);
    pFVar7 = (FILE *)local_10b8;
    if ((char *)local_10b8._8_8_ == (char *)0x0) {
      pFVar7 = __stream;
    }
    __endptr = (char **)0x1ab177;
    iVar3 = strcmp(*(char **)pFVar7,"\r\n");
    if (iVar3 != 0) {
      uVar12 = 1;
      psVar10 = __n;
      break;
    }
    _Var4 = stream_line_reader::getline((stream_line_reader *)local_10d8,__endptr,__n,__stream);
    if ((char)_Var4 == '\0') goto LAB_0016755b;
    puVar8 = (undefined8 *)local_10b8;
    if ((char *)local_10b8._8_8_ == (char *)0x0) {
      puVar8 = (undefined8 *)(local_10d8 + 8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1038._M_pod_data,(char *)*puVar8,(allocator<char> *)&local_10e0);
    uVar9 = local_1038._M_unused._0_8_;
    iVar3 = *piVar5;
    *piVar5 = 0;
    __endptr = (char **)local_10e8;
    lVar6 = strtol((char *)local_1038._M_unused._0_8_,__endptr,0x10);
    if (local_10e8 == (undefined1  [8])uVar9) {
LAB_0016759e:
      std::__throw_invalid_argument("stoi");
      goto LAB_001675aa;
    }
    __stream = (FILE *)0xffffffff00000000;
    if ((lVar6 - 0x80000000U < 0xffffffff00000000) || (*piVar5 == 0x22)) {
      std::__throw_out_of_range("stoi");
      goto LAB_0016759e;
    }
    if (*piVar5 == 0) {
      *piVar5 = iVar3;
    }
    psVar10 = extraout_RDX_05;
    if ((_Any_data *)local_1038._M_unused._0_8_ != local_1028) {
      __endptr = (char **)(local_1028[0]._M_unused._M_member_pointer + 1);
      operator_delete(local_1038._M_unused._M_object,(ulong)__endptr);
      psVar10 = extraout_RDX_06;
    }
    __x = local_1070;
    iVar11 = (int)lVar6;
  }
  if (uVar12 == 0) {
    _Var4 = stream_line_reader::getline((stream_line_reader *)local_10d8,__endptr,psVar10,__stream);
    if ((char)_Var4 != '\0') {
      puVar8 = (undefined8 *)local_10b8;
      if ((char *)local_10b8._8_8_ == (char *)0x0) {
        puVar8 = (undefined8 *)(local_10d8 + 8);
      }
      iVar3 = strcmp((char *)*puVar8,"\r\n");
      if (iVar3 == 0) goto LAB_00167522;
    }
LAB_0016755b:
    bVar2 = false;
  }
  else {
LAB_00167522:
    bVar2 = true;
  }
  if ((FILE *)local_10b8._0_8_ != (FILE *)local_10a8) {
    operator_delete((void *)local_10b8._0_8_,CONCAT71(local_10a8._1_7_,local_10a8[0]) + 1);
  }
  return bVar2;
}

Assistant:

inline bool read_content_chunked(Stream &strm, ContentReceiver out) {
  const auto bufsiz = 16;
  char buf[bufsiz];

  stream_line_reader line_reader(strm, buf, bufsiz);

  if (!line_reader.getline()) { return false; }

  auto chunk_len = std::stoi(line_reader.ptr(), 0, 16);

  while (chunk_len > 0) {
    if (!read_content_with_length(strm, chunk_len, nullptr, out)) {
      return false;
    }

    if (!line_reader.getline()) { return false; }

    if (strcmp(line_reader.ptr(), "\r\n")) { break; }

    if (!line_reader.getline()) { return false; }

    chunk_len = std::stoi(line_reader.ptr(), 0, 16);
  }

  if (chunk_len == 0) {
    // Reader terminator after chunks
    if (!line_reader.getline() || strcmp(line_reader.ptr(), "\r\n"))
      return false;
  }

  return true;
}